

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetPropertyWithDescriptor<true>
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyRecord *propertyRecord,DictionaryPropertyDescriptor<unsigned_short> **pdescriptor,
          Var value,PropertyOperationFlags flags,PropertyValueInfo *info)

{
  Type *pTVar1;
  PropertyAttributes PVar2;
  byte bVar3;
  RecyclerWeakReference<Js::DynamicObject> *pRVar4;
  ScriptContext *scriptContext;
  DictionaryPropertyDescriptor<unsigned_short> *this_00;
  code *pcVar5;
  uint propertyId;
  bool bVar6;
  bool bVar7;
  Flags FVar8;
  unsigned_short uVar9;
  BOOL BVar10;
  undefined4 *puVar11;
  UndeclaredBlockVariable *pUVar12;
  Var aValue;
  RecyclableObject *function;
  Flags FVar13;
  PropertyOperationFlags index;
  PropertyRecord *this_01;
  Var pvVar14;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> local_60;
  PropertyRecord *local_58;
  PropertyRecord *propertyRecord_local;
  Var local_48;
  DictionaryTypeHandlerBase<unsigned_short> *local_40;
  uint local_38;
  PropertyOperationFlags local_34;
  
  local_58 = propertyRecord;
  local_40 = this;
  local_34 = flags;
  if ((pdescriptor == (DictionaryPropertyDescriptor<unsigned_short> **)0x0) ||
     (this_01 = (PropertyRecord *)*pdescriptor, this_01 == (PropertyRecord *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e3,"(pdescriptor && *pdescriptor)","pdescriptor && *pdescriptor"
                               );
    if (!bVar6) goto LAB_00c2e178;
    *puVar11 = 0;
    this_01 = (PropertyRecord *)*pdescriptor;
  }
  local_38 = propertyRecord->pid;
  bVar6 = instance == (DynamicObject *)0x0;
  local_48 = value;
  if (bVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e6,"(instance)","instance");
    if (!bVar7) goto LAB_00c2e178;
    *puVar11 = 0;
  }
  if ((((ulong)(this_01->super_FinalizableObject).super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject & 0x800) != 0) &&
     (((ulong)(this_01->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject & 2) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e7,
                                "((descriptor->Attributes & 0x08) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()))"
                                ,
                                "(descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed())"
                               );
    if (!bVar7) goto LAB_00c2e178;
    *puVar11 = 0;
  }
  if (((local_40->super_DynamicTypeHandler).flags & 0x18) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2ea,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar7) goto LAB_00c2e178;
    *puVar11 = 0;
  }
  pRVar4 = (local_40->singletonInstance).ptr;
  if (pRVar4 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    if ((DynamicObject *)(pRVar4->super_RecyclerWeakReferenceBase).strongRef == instance) {
      bVar6 = true;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x2ed,
                                  "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                 );
      if (!bVar6) goto LAB_00c2e178;
      *puVar11 = 0;
      bVar6 = false;
    }
  }
  uVar9 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<true>
                    ((DictionaryPropertyDescriptor<unsigned_short> *)this_01);
  if (uVar9 == 0xffff) {
    uVar9 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex
                      ((DictionaryPropertyDescriptor<unsigned_short> *)this_01);
    pvVar14 = local_48;
    if (uVar9 != 0xffff) {
      uVar9 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex
                        ((DictionaryPropertyDescriptor<unsigned_short> *)this_01);
      aValue = DynamicObject::GetSlot(instance,(uint)uVar9);
      function = VarTo<Js::RecyclableObject>(aValue);
      JavascriptOperators::CallSetter(function,instance,pvVar14,(ScriptContext *)0x0);
      bVar6 = JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetReference<Js::PropertyRecord_const*>
                        ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)(local_40->propertyMap).ptr,&local_58,pdescriptor);
      if (bVar6) {
        this_00 = *pdescriptor;
        uVar9 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(this_00);
        if (uVar9 == 0xffff) {
          uVar9 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(this_00);
          if (uVar9 != 0xffff) {
            uVar9 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(this_00);
            if (info != (PropertyValueInfo *)0x0) {
              PVar2 = this_00->Attributes;
              info->m_instance = &instance->super_RecyclableObject;
              info->m_propertyIndex = uVar9;
              info->m_attributes = PVar2;
              info->flags = InlineCacheSetterFlag;
            }
          }
        }
        else if (info != (PropertyValueInfo *)0x0) {
          PVar2 = this_00->Attributes;
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = uVar9;
          info->m_attributes = PVar2;
          info->flags = InlineCacheNoFlags;
        }
      }
      else {
        *pdescriptor = (DictionaryPropertyDescriptor<unsigned_short> *)0x0;
      }
    }
    goto LAB_00c2e08e;
  }
  if ((-1 < (char)(undefined1)local_34) &&
     (0x3f < *(PropertyAttributes *)
              ((long)&(this_01->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject + 1))) {
    scriptContext =
         (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
    propertyRecord_local = this_01;
    pUVar12 = (UndeclaredBlockVariable *)DynamicObject::GetSlot(instance,(uint)uVar9);
    this_01 = propertyRecord_local;
    if ((((scriptContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr
        == pUVar12) {
      JavascriptError::ThrowReferenceError(scriptContext,-0x7ff5ec07,(PCWSTR)0x0);
    }
  }
  pvVar14 = local_48;
  index = (PropertyOperationFlags)uVar9;
  FVar13 = *(Flags *)&(this_01->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject;
  if ((FVar13 & IsInitialized) == None) {
    if ((((local_34 & PropertyOperation_PreInit) == PropertyOperation_None) &&
        (*(Flags *)&(this_01->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject = FVar13 | IsInitialized, bVar6)) &&
       ((local_34 & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
        PropertyOperation_None && 0xf < local_38)) {
      local_34 = index;
      if (local_48 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x305,"(value != nullptr)","value != nullptr");
        if (!bVar6) goto LAB_00c2e178;
        *puVar11 = 0;
      }
      BVar10 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
      if (BVar10 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x307,"(!instance->IsExternal())","!instance->IsExternal()");
        if (!bVar6) {
LAB_00c2e178:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar11 = 0;
      }
      bVar6 = VarIs<Js::JavascriptFunction>(pvVar14);
      if (bVar6) {
        bVar6 = DynamicTypeHandler::ShouldFixMethodProperties();
LAB_00c2e14f:
        FVar13 = *(Flags *)&(this_01->super_FinalizableObject).super_IRecyclerVisitedObject.
                            _vptr_IRecyclerVisitedObject & ~IsFixed;
        if (bVar6 == false) goto LAB_00c2e168;
        FVar8 = IsFixed;
      }
      else {
        bVar6 = DynamicTypeHandler::ShouldFixDataProperties();
        if (bVar6) {
          bVar6 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_38,pvVar14);
          goto LAB_00c2e14f;
        }
        FVar13 = *(Flags *)&(this_01->super_FinalizableObject).super_IRecyclerVisitedObject.
                            _vptr_IRecyclerVisitedObject & ~IsFixed;
LAB_00c2e168:
        FVar8 = None;
      }
      *(Flags *)&(this_01->super_FinalizableObject).super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject = FVar13 | FVar8;
      index = local_34;
    }
  }
  else {
    InvalidateFixedField<int>
              (local_40,instance,local_38,(DictionaryPropertyDescriptor<unsigned_short> *)this_01);
  }
  pvVar14 = local_48;
  DynamicTypeHandler::SetSlotUnchecked(instance,index,local_48);
  if (((ulong)(this_01->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject & 0x28) == 8) {
    if (info != (PropertyValueInfo *)0x0) {
      bVar3 = *(PropertyAttributes *)
               ((long)&(this_01->super_FinalizableObject).super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject + 1);
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = uVar9;
      info->m_attributes = bVar3 >> 2 & 4 | bVar3;
      info->flags = InlineCacheNoFlags;
    }
  }
  else if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = &instance->super_RecyclableObject;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
  }
LAB_00c2e08e:
  propertyId = local_38;
  bVar6 = NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(local_38);
  if ((bVar6) &&
     (pTVar1 = &(local_40->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
     ((local_40->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::WriteBarrierSet
              (&local_60,
               &((((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                   super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                javascriptLibrary)->typesWithNoSpecialPropertyProtoChain);
    PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(local_60.ptr);
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&local_40->super_DynamicTypeHandler,instance,propertyId,pvVar14,SideEffects_Any);
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::SetPropertyWithDescriptor(
        _In_ DynamicObject* instance,
        _In_ PropertyRecord const* propertyRecord,
        _Inout_ DictionaryPropertyDescriptor<T> ** pdescriptor,
        _In_ Var value,
        _In_ PropertyOperationFlags flags,
        _Inout_opt_ PropertyValueInfo* info)
    {
        Assert(pdescriptor && *pdescriptor);
        DictionaryPropertyDescriptor<T> * descriptor = *pdescriptor;
        PropertyId propertyId = propertyRecord->GetPropertyId();
        Assert(instance);
        Assert((descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()));

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
#endif
        T dataSlotAllowLetConstGlobal = descriptor->template GetDataPropertyIndex<allowLetConstGlobal>();
        if (dataSlotAllowLetConstGlobal != NoSlots)
        {
            if (allowLetConstGlobal
                && (descriptor->Attributes & PropertyNoRedecl)
                && !(flags & PropertyOperation_AllowUndecl))
            {
                ScriptContext* scriptContext = instance->GetScriptContext();
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(dataSlotAllowLetConstGlobal)))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }
#if ENABLE_FIXED_FIELDS
            if (!descriptor->GetIsInitialized())
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    descriptor->SetIsInitialized(true);
                    if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(instance, propertyId, descriptor);
            }
#endif
            SetSlotUnchecked(instance, dataSlotAllowLetConstGlobal, value);
            // If we just added a fixed method, don't populate the inline cache so that we always take the slow path
            // when overwriting this property and correctly invalidate any JIT-ed code that hard-coded this method.
            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, dataSlotAllowLetConstGlobal, GetLetConstGlobalPropertyAttributes<allowLetConstGlobal>(descriptor->Attributes));
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }
        else if (descriptor->GetSetterPropertyIndex() != NoSlots)
        {
            RecyclableObject* func = VarTo<RecyclableObject>(instance->GetSlot(descriptor->GetSetterPropertyIndex()));
            JavascriptOperators::CallSetter(func, instance, value, NULL);

            // Wait for the setter to return before setting up the inline cache info, as the setter may change
            // the attributes

            if (propertyMap->TryGetReference(propertyRecord, pdescriptor))
            {
                descriptor = *pdescriptor;
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, dataSlot, descriptor->Attributes);
                }
                else if (descriptor->GetSetterPropertyIndex() != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, descriptor->GetSetterPropertyIndex(), descriptor->Attributes, InlineCacheSetterFlag);
                }
            }
            else
            {
                *pdescriptor = nullptr;
            }
        }
        if (NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyId))
        {
            this->SetHasSpecialProperties();
            if (GetFlags() & IsPrototypeFlag)
            {
                instance->GetScriptContext()->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
            }
        }
        SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
    }